

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O2

void init_inter_mode_params
               (MV *src_mv,InterPredParams *inter_pred_params,SubpelParams *subpel_params,
               scale_factors *sf,int width,int height)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  inter_pred_params->scale_factors = sf;
  iVar5 = ((int)src_mv->row << (1U - (char)inter_pred_params->subsampling_y & 0x1f)) +
          inter_pred_params->pix_row * 0x10;
  iVar7 = ((int)src_mv->col << (1U - (char)inter_pred_params->subsampling_x & 0x1f)) +
          inter_pred_params->pix_col * 0x10;
  iVar1 = av1_is_scaled(sf);
  if (iVar1 == 0) {
    iVar5 = iVar5 * 0x40;
    iVar7 = iVar7 * 0x40;
  }
  else {
    lVar2 = (long)(sf->y_scale_fp * 8 + -0x20000) + (long)iVar5 * (long)sf->y_scale_fp;
    if (lVar2 < 0) {
      iVar5 = -(int)((ulong)(0x80 - lVar2) >> 8);
    }
    else {
      iVar5 = (int)((ulong)(lVar2 + 0x80) >> 8);
    }
    lVar2 = (long)(sf->x_scale_fp * 8 + -0x20000) + (long)iVar7 * (long)sf->x_scale_fp;
    if (lVar2 < 0) {
      iVar7 = -(int)((ulong)(0x80 - lVar2) >> 8);
    }
    else {
      iVar7 = (int)((ulong)(lVar2 + 0x80) >> 8);
    }
  }
  uVar8 = iVar7 + 0x20;
  uVar6 = iVar5 + 0x20;
  uVar3 = height * 0x400 + 0x1000;
  uVar4 = width * 0x400 + 0x1000;
  if ((int)uVar6 < (int)uVar3) {
    uVar3 = uVar6;
  }
  if ((int)uVar6 < inter_pred_params->top) {
    uVar3 = inter_pred_params->top;
  }
  if ((int)uVar8 < (int)uVar4) {
    uVar4 = uVar8;
  }
  if ((int)uVar8 < inter_pred_params->left) {
    uVar4 = inter_pred_params->left;
  }
  subpel_params->pos_x = uVar4;
  subpel_params->pos_y = uVar3;
  subpel_params->subpel_x = uVar4 & 0x3ff;
  subpel_params->subpel_y = uVar3 & 0x3ff;
  iVar1 = sf->y_step_q4;
  subpel_params->xs = sf->x_step_q4;
  subpel_params->ys = iVar1;
  return;
}

Assistant:

static inline void init_inter_mode_params(
    const MV *const src_mv, InterPredParams *const inter_pred_params,
    SubpelParams *subpel_params, const struct scale_factors *sf, int width,
    int height) {
  inter_pred_params->scale_factors = sf;
  init_subpel_params(src_mv, inter_pred_params, subpel_params, width, height);
}